

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_db_name(sqlite3 *db,int N)

{
  int N_local;
  sqlite3 *db_local;
  char *local_8;
  
  if ((N < 0) || (db->nDb <= N)) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = db->aDb[N].zDbSName;
  }
  return local_8;
}

Assistant:

SQLITE_API const char *sqlite3_db_name(sqlite3 *db, int N){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( N<0 || N>=db->nDb ){
    return 0;
  }else{
    return db->aDb[N].zDbSName;
  }
}